

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_sqlite.cpp
# Opt level: O1

sqlite3_value * duckdb::CastToSQLiteValue::OperationNull(void)

{
  sqlite3_value *sqlite_null;
  sqlite3_value *in_RDI;
  
  (in_RDI->str)._M_dataplus._M_p = (pointer)&(in_RDI->str).field_2;
  (in_RDI->str)._M_string_length = 0;
  (in_RDI->str).field_2._M_local_buf[0] = '\0';
  in_RDI->type = NULL_VALUE;
  (in_RDI->u).r = 0.0;
  return in_RDI;
}

Assistant:

sqlite3_value CastToSQLiteValue::OperationNull() {
	sqlite3_value sqlite_null;
	sqlite_null.type = SQLiteTypeValue::NULL_VALUE;
	sqlite_null.u.i = 0;
	sqlite_null.u.r = 0.0;
	return sqlite_null;
}